

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnd_p.h
# Opt level: O0

void __thiscall QDragPrivate::QDragPrivate(QDragPrivate *this)

{
  QPixmap *in_RDI;
  
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  (in_RDI->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QDragPrivate_00e22838;
  in_RDI[5].super_QPaintDevice._vptr_QPaintDevice = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[5].super_QPaintDevice.painters = 0;
  in_RDI[5].data.d.ptr = (QPlatformPixmap *)0x0;
  QPixmap::QPixmap(in_RDI);
  QPoint::QPoint((QPoint *)in_RDI);
  QFlags<Qt::DropAction>::QFlags((QFlags<Qt::DropAction> *)0x982580);
  QMap<Qt::DropAction,_QPixmap>::QMap((QMap<Qt::DropAction,_QPixmap> *)0x982591);
  return;
}

Assistant:

QDragPrivate()
        : source(nullptr)
        , target(nullptr)
        , data(nullptr)
    { }